

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

string * ot::commissioner::Console::Read_abi_cxx11_(void)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  string *in_RDI;
  bool bVar4;
  allocator local_45 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *line;
  
  local_18 = anon_var_dwarf_3ea58f + 9;
  while( true ) {
    bVar4 = true;
    if (local_18 != (char *)0x0) {
      sVar2 = strlen(local_18);
      bVar4 = sVar2 == 0;
    }
    if (!bVar4) break;
    std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   mPrompt_abi_cxx11_,"> ");
    uVar3 = std::__cxx11::string::c_str();
    local_18 = (char *)readline(uVar3);
    std::__cxx11::string::~string((string *)&local_38);
  }
  add_history(local_18);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  return in_RDI;
}

Assistant:

std::string Console::Read()
{
    const char *line = "";

    while (line == nullptr || strlen(line) == 0)
    {
        line = readline((mPrompt + "> ").c_str());
    }

    add_history(line);

    return line;
}